

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereOrInsert(WhereOrSet *pSet,Bitmask prereq,LogEst rRun,LogEst nOut)

{
  ushort uVar1;
  WhereOrCost *p;
  u16 i;
  LogEst nOut_local;
  LogEst rRun_local;
  Bitmask prereq_local;
  WhereOrSet *pSet_local;
  
  p = pSet->a;
  for (i = pSet->n; i != 0; i = i - 1) {
    if ((rRun <= p->rRun) && ((prereq & p->prereq) == prereq)) goto LAB_00206d42;
    if ((p->rRun <= rRun) && ((p->prereq & prereq) == p->prereq)) {
      return 0;
    }
    p = p + 1;
  }
  if (pSet->n < 3) {
    uVar1 = pSet->n;
    pSet->n = uVar1 + 1;
    p = pSet->a + uVar1;
    p->nOut = nOut;
  }
  else {
    p = pSet->a;
    for (i = 1; i < pSet->n; i = i + 1) {
      if (pSet->a[i].rRun < p->rRun) {
        p = pSet->a + (int)(uint)i;
      }
    }
    if (p->rRun <= rRun) {
      return 0;
    }
  }
LAB_00206d42:
  p->prereq = prereq;
  p->rRun = rRun;
  if (nOut < p->nOut) {
    p->nOut = nOut;
  }
  return 1;
}

Assistant:

static int whereOrInsert(
  WhereOrSet *pSet,      /* The WhereOrSet to be updated */
  Bitmask prereq,        /* Prerequisites of the new entry */
  LogEst rRun,           /* Run-cost of the new entry */
  LogEst nOut            /* Number of outputs for the new entry */
){
  u16 i;
  WhereOrCost *p;
  for(i=pSet->n, p=pSet->a; i>0; i--, p++){
    if( rRun<=p->rRun && (prereq & p->prereq)==prereq ){
      goto whereOrInsert_done;
    }
    if( p->rRun<=rRun && (p->prereq & prereq)==p->prereq ){
      return 0;
    }
  }
  if( pSet->n<N_OR_COST ){
    p = &pSet->a[pSet->n++];
    p->nOut = nOut;
  }else{
    p = pSet->a;
    for(i=1; i<pSet->n; i++){
      if( p->rRun>pSet->a[i].rRun ) p = pSet->a + i;
    }
    if( p->rRun<=rRun ) return 0;
  }
whereOrInsert_done:
  p->prereq = prereq;
  p->rRun = rRun;
  if( p->nOut>nOut ) p->nOut = nOut;
  return 1;
}